

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::considerInfeasibleValueIn(HEkkPrimal *this)

{
  long lVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *this_00;
  long *in_RDI;
  double random_value;
  HEkkPrimal *unaff_retaddr;
  double bound_shift;
  double primal_infeasibility;
  double cost;
  HighsInt bound_violated;
  double upper;
  double lower;
  double base;
  HighsSimplexInfo *info;
  double local_48;
  HighsLogOptions *local_40;
  double local_38;
  uint local_2c;
  double *shift;
  double *bound;
  long *plVar3;
  
  lVar1 = *in_RDI;
  this_00 = (vector<double,_std::allocator<double>_> *)(lVar1 + 0x2560);
  random_value = *(double *)(lVar1 + 0x2820) * 5e-07;
  plVar3 = in_RDI;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x25a8),
                      (long)*(int *)((long)in_RDI + 0x44));
  bound = (double *)*pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this_00 + 4,(long)*(int *)((long)in_RDI + 0x44));
  shift = (double *)*pvVar2;
  if ((double)bound - (double)in_RDI[5] <= (double)in_RDI[0xd]) {
    local_2c = (uint)((double)shift + (double)in_RDI[5] < (double)in_RDI[0xd]);
  }
  else {
    local_2c = 0xffffffff;
  }
  if (local_2c != 0) {
    if (*(int *)((long)in_RDI + 0x1c) == 1) {
      *(int *)&this_00[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start =
           *(int *)&this_00[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
      local_38 = (double)(int)local_2c;
      if ((random_value != 0.0) || (NAN(random_value))) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00 + 0xc,(long)*(int *)((long)in_RDI + 0x4c));
        local_38 = (random_value * *pvVar2 + 1.0) * local_38;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)*(int *)((long)in_RDI + 0x44));
      *pvVar2 = local_38;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00 + 1,(long)*(int *)((long)in_RDI + 0x44));
      *pvVar2 = local_38 + *pvVar2;
    }
    else if (*(int *)((long)in_RDI + 0x63c) == 0) {
      if ((int)local_2c < 0) {
        local_40 = (HighsLogOptions *)((double)bound - (double)in_RDI[0xd]);
      }
      else {
        local_40 = (HighsLogOptions *)((double)in_RDI[0xd] - (double)shift);
      }
      *(int *)&this_00[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start =
           *(int *)&this_00[0x25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
      highsLogDev(local_40,(HighsLogType)bound,(char *)in_RDI[0xd],shift,
                  *(long *)(*in_RDI + 8) + 0x380,4,
                  "Entering variable has primal infeasibility of %g for [%g, %g, %g]\n");
      *(undefined4 *)(in_RDI + 8) = 8;
    }
    else {
      if ((int)local_2c < 1) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (this_00 + 0xc,(long)*(int *)((long)in_RDI + 0x44));
        std::vector<double,_std::allocator<double>_>::operator[]
                  (this_00 + 3,(long)*(int *)((long)in_RDI + 0x44));
        shiftBound(unaff_retaddr,SUB81((ulong)plVar3 >> 0x38,0),(HighsInt)plVar3,(double)this_00,
                   random_value,bound,shift);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00 + 7,(long)*(int *)((long)in_RDI + 0x44));
        *pvVar2 = local_48 + *pvVar2;
      }
      else {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (this_00 + 0xc,(long)*(int *)((long)in_RDI + 0x44));
        std::vector<double,_std::allocator<double>_>::operator[]
                  (this_00 + 4,(long)*(int *)((long)in_RDI + 0x44));
        shiftBound(unaff_retaddr,SUB81((ulong)plVar3 >> 0x38,0),(HighsInt)plVar3,(double)this_00,
                   random_value,bound,shift);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00 + 8,(long)*(int *)((long)in_RDI + 0x44));
        *pvVar2 = local_48 + *pvVar2;
      }
      *(undefined1 *)
       ((long)&this_00[0x24].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 6) = 1;
    }
    HEkk::invalidatePrimalMaxSumInfeasibilityRecord((HEkk *)*in_RDI);
  }
  return;
}

Assistant:

void HEkkPrimal::considerInfeasibleValueIn() {
  assert(row_out >= 0);
  HighsSimplexInfo& info = ekk_instance_.info_;
  // Determine the base value for cost perturbation
  const double base =
      info.primal_simplex_phase1_cost_perturbation_multiplier * 5e-7;
  const double lower = info.workLower_[variable_in];
  const double upper = info.workUpper_[variable_in];
  HighsInt bound_violated = 0;
  if (value_in < lower - primal_feasibility_tolerance) {
    bound_violated = -1;
  } else if (value_in > upper + primal_feasibility_tolerance) {
    bound_violated = 1;
  }
  if (!bound_violated) return;
  // The primal value of the entering variable is not feasible
  if (solve_phase == kSolvePhase1) {
    info.num_primal_infeasibilities++;
    double cost = bound_violated;
    if (base) cost *= 1 + base * info.numTotRandomValue_[row_out];
    info.workCost_[variable_in] = cost;
    info.workDual_[variable_in] += cost;
  } else if (primal_correction_strategy ==
             kSimplexPrimalCorrectionStrategyNone) {
    // @primal_infeasibility calculation
    double primal_infeasibility;
    if (bound_violated < 0) {
      primal_infeasibility = lower - value_in;
    } else {
      primal_infeasibility = value_in - upper;
    }
    info.num_primal_infeasibilities++;
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kWarning,
        "Entering variable has primal infeasibility of %g for [%g, %g, %g]\n",
        primal_infeasibility, lower, value_in, upper);
    rebuild_reason = kRebuildReasonPrimalInfeasibleInPrimalSimplex;
  } else {
    double bound_shift;
    if (bound_violated > 0) {
      // Perturb the upper bound to accommodate the infeasibility
      shiftBound(false, variable_in, value_in,
                 info.numTotRandomValue_[variable_in],
                 info.workUpper_[variable_in], bound_shift);
      info.workUpperShift_[variable_in] += bound_shift;
    } else {
      // Perturb the lower bound to accommodate the infeasibility
      shiftBound(true, variable_in, value_in,
                 info.numTotRandomValue_[variable_in],
                 info.workLower_[variable_in], bound_shift);
      info.workLowerShift_[variable_in] += bound_shift;
    }
    info.bounds_perturbed = true;
  }
  ekk_instance_.invalidatePrimalMaxSumInfeasibilityRecord();
}